

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirentryinfo_p.h
# Opt level: O2

void __thiscall QDirEntryInfo::~QDirEntryInfo(QDirEntryInfo *this)

{
  std::_Optional_payload_base<QFileInfo>::_M_reset
            ((_Optional_payload_base<QFileInfo> *)&this->fileInfoOpt);
  QFileSystemEntry::~QFileSystemEntry(&this->entry);
  return;
}

Assistant:

const QFileSystemMetaData &ensureFilled(QFileSystemMetaData::MetaDataFlags what)
    {
        if (!metaData.hasFlags(what))
            QFileSystemEngine::fillMetaData(entry, metaData, what);
        return metaData;
    }